

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber.cc
# Opt level: O1

int cbs_convert_ber(CBS *in,CBB *out,CBS_ASN1_TAG string_tag,int looking_for_eoc,uint32_t depth)

{
  int iVar1;
  uint uVar2;
  uint tag_00;
  CBB *cbb;
  CBS *in_00;
  CBS_ASN1_TAG string_tag_00;
  bool bVar3;
  CBS_ASN1_TAG tag;
  int indefinite;
  CBS contents;
  size_t header_len;
  CBB out_contents_storage;
  uint local_8c;
  CBB *local_88;
  int local_7c;
  CBS local_78;
  size_t local_68;
  CBB local_60;
  
  local_88 = out;
  if ((string_tag >> 0x1d & 1) != 0) {
    __assert_fail("!(string_tag & CBS_ASN1_CONSTRUCTED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/ber.cc"
                  ,0x72,"int cbs_convert_ber(CBS *, CBB *, CBS_ASN1_TAG, int, uint32_t)");
  }
  if (depth < 0x81) {
    do {
      if (in->len == 0) {
        return (uint)(looking_for_eoc == 0);
      }
      if ((((in->len != 1 && looking_for_eoc != 0) && (*in->data == '\0')) && (in->data[1] == '\0'))
         && (iVar1 = CBS_skip(in,2), iVar1 != 0)) {
        return 1;
      }
      iVar1 = CBS_get_any_ber_asn1_element(in,&local_78,&local_8c,&local_68,(int *)0x0,&local_7c);
      bVar3 = true;
      if (iVar1 != 0) {
        if (string_tag == 0) {
          tag_00 = local_8c;
          string_tag_00 = 0;
          if ((local_8c >> 0x1d & 1) != 0) {
            uVar2 = local_8c & 0xdfffffff;
            string_tag_00 = 0;
            if ((0x2183efefU >> ((byte)local_8c & 0x1f) & 1) == 0 && uVar2 < 0x1f) {
              tag_00 = uVar2;
              string_tag_00 = uVar2;
            }
          }
          iVar1 = CBB_add_asn1(local_88,&local_60,tag_00);
          if (iVar1 != 0) {
            cbb = &local_60;
            goto LAB_0020ca90;
          }
        }
        else {
          cbb = local_88;
          string_tag_00 = string_tag;
          if ((local_8c & 0xdfffffff) == string_tag) {
LAB_0020ca90:
            if (local_7c == 0) {
              iVar1 = CBS_skip(&local_78,local_68);
              if (iVar1 == 0) goto LAB_0020caf8;
              if ((local_8c & 0x20000000) != 0) {
                in_00 = &local_78;
                iVar1 = 0;
                goto LAB_0020caaa;
              }
              iVar1 = CBB_add_bytes(cbb,local_78.data,local_78.len);
            }
            else {
              iVar1 = 1;
              in_00 = in;
LAB_0020caaa:
              iVar1 = cbs_convert_ber(in_00,cbb,string_tag_00,iVar1,depth + 1);
            }
            if (iVar1 != 0) {
              iVar1 = CBB_flush(local_88);
              bVar3 = iVar1 == 0;
            }
          }
        }
      }
LAB_0020caf8:
    } while (!bVar3);
  }
  return 0;
}

Assistant:

static int cbs_convert_ber(CBS *in, CBB *out, CBS_ASN1_TAG string_tag,
                           int looking_for_eoc, uint32_t depth) {
  assert(!(string_tag & CBS_ASN1_CONSTRUCTED));

  if (depth > kMaxDepth) {
    return 0;
  }

  while (CBS_len(in) > 0) {
    if (looking_for_eoc && cbs_get_eoc(in)) {
      return 1;
    }

    CBS contents;
    CBS_ASN1_TAG tag, child_string_tag = string_tag;
    size_t header_len;
    int indefinite;
    CBB *out_contents, out_contents_storage;
    if (!CBS_get_any_ber_asn1_element(in, &contents, &tag, &header_len,
                                      /*out_ber_found=*/NULL, &indefinite)) {
      return 0;
    }

    if (string_tag != 0) {
      // This is part of a constructed string. All elements must match
      // |string_tag| up to the constructed bit and get appended to |out|
      // without a child element.
      if ((tag & ~CBS_ASN1_CONSTRUCTED) != string_tag) {
        return 0;
      }
      out_contents = out;
    } else {
      CBS_ASN1_TAG out_tag = tag;
      if ((tag & CBS_ASN1_CONSTRUCTED) && is_string_type(tag)) {
        // If a constructed string, clear the constructed bit and inform
        // children to concatenate bodies.
        out_tag &= ~CBS_ASN1_CONSTRUCTED;
        child_string_tag = out_tag;
      }
      if (!CBB_add_asn1(out, &out_contents_storage, out_tag)) {
        return 0;
      }
      out_contents = &out_contents_storage;
    }

    if (indefinite) {
      if (!cbs_convert_ber(in, out_contents, child_string_tag,
                           /*looking_for_eoc=*/1, depth + 1) ||
          !CBB_flush(out)) {
        return 0;
      }
      continue;
    }

    if (!CBS_skip(&contents, header_len)) {
      return 0;
    }

    if (tag & CBS_ASN1_CONSTRUCTED) {
      // Recurse into children.
      if (!cbs_convert_ber(&contents, out_contents, child_string_tag,
                           /*looking_for_eoc=*/0, depth + 1)) {
        return 0;
      }
    } else {
      // Copy primitive contents as-is.
      if (!CBB_add_bytes(out_contents, CBS_data(&contents),
                         CBS_len(&contents))) {
        return 0;
      }
    }

    if (!CBB_flush(out)) {
      return 0;
    }
  }

  return looking_for_eoc == 0;
}